

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MissingPropertyTypeHandler.cpp
# Opt level: O0

DynamicTypeHandler * __thiscall
Js::MissingPropertyTypeHandler::Clone(MissingPropertyTypeHandler *this,Recycler *recycler)

{
  Recycler *alloc;
  DynamicTypeHandler *this_00;
  TrackAllocData local_40;
  Recycler *local_18;
  Recycler *recycler_local;
  MissingPropertyTypeHandler *this_local;
  
  local_18 = recycler;
  recycler_local = (Recycler *)this;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_40,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/MissingPropertyTypeHandler.cpp"
             ,0x14);
  alloc = Memory::Recycler::TrackAllocInfo(recycler,&local_40);
  this_00 = (DynamicTypeHandler *)new<Memory::Recycler>(0x18,alloc,0x43c4b0);
  MissingPropertyTypeHandler((MissingPropertyTypeHandler *)this_00);
  return this_00;
}

Assistant:

DynamicTypeHandler * MissingPropertyTypeHandler::Clone(Recycler * recycler)
    {
        return RecyclerNew(recycler, MissingPropertyTypeHandler);
    }